

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  Pgno *pPVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  ushort uVar6;
  long lVar7;
  BtCursor *pBVar8;
  BtShared *pBVar9;
  u8 *puVar10;
  PgHdr *pPVar11;
  u8 uVar12;
  undefined1 uVar13;
  i64 iVar14;
  char cVar15;
  u16 uVar16;
  u16 uVar17;
  ushort uVar18;
  int iVar19;
  u32 uVar20;
  Pgno PVar21;
  int iVar22;
  BtCursor **ppBVar23;
  void *pvVar24;
  MemPage *pMVar25;
  ulong uVar26;
  undefined1 *puVar27;
  long lVar28;
  MemPage **ppMVar29;
  long lVar30;
  uint uVar31;
  u16 *puVar32;
  undefined4 *puVar33;
  MemPage **ppMVar34;
  MemPage *pMVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar39;
  Pgno PVar40;
  size_t __n;
  ulong uVar41;
  long lVar42;
  MemPage **ppMVar43;
  uint uVar44;
  MemPage *pMVar45;
  uint uVar46;
  int iVar47;
  int nCell;
  int iVar48;
  MemPage *pPage;
  long lVar49;
  u8 *puVar50;
  u8 *puVar51;
  ulong uVar52;
  MemPage *pMVar53;
  long in_FS_OFFSET;
  bool bVar54;
  int local_2dc;
  MemPage *local_2d8;
  ulong local_2d0;
  MemPage *local_2c8;
  MemPage *local_2c0;
  ulong local_2b8;
  MemPage *local_2b0;
  char local_2a1;
  MemPage *local_2a0;
  MemPage *local_298;
  MemPage *local_290;
  MemPage *local_288;
  MemPage *local_280;
  BtShared *local_278;
  MemPage *local_270;
  void *local_268;
  Pgno local_25c;
  Pgno pgnoNew;
  Pgno local_254 [7];
  ulong local_238;
  MemPage *local_230;
  MemPage *apOld [3];
  int szNew [5];
  u8 abDone [5];
  char local_1d8;
  CellInfo local_1a0;
  MemPage *pNew;
  MemPage *local_180 [4];
  uint local_15c;
  MemPage *pChild;
  MemPage *pMStack_150;
  MemPage *local_148;
  MemPage *pMStack_140;
  MemPage *local_138;
  u8 *puStack_130;
  u8 *local_128;
  u8 *puStack_120;
  u8 *local_118;
  u8 *puStack_110;
  Pgno local_108 [7];
  int iStack_ec;
  u16 szCell;
  Pgno aPgOrder [5];
  long lStack_b0;
  u8 *apDiv [2];
  u16 aPgFlags [5];
  Pgno aPgno [5];
  u8 aBalanceQuickSpace [13];
  MemPage *pMVar38;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  local_268 = (void *)0x0;
  pPage = pCur->pPage;
LAB_00140416:
  if ((pPage->nFree < 0) && (iVar19 = btreeComputeFreeSpace(pPage), iVar19 != 0)) {
    iVar19 = 0;
  }
  else if (pPage->nOverflow == '\0') {
    iVar19 = 0;
    if (((int)(pCur->pBt->usableSize * 2) < pPage->nFree * 3) &&
       (cVar15 = pCur->iPage, iVar19 = 0, cVar15 != '\0')) {
LAB_0014049a:
      pMVar53 = pCur->apPage[(long)cVar15 + -1];
      uVar18 = pCur->aiIdx[(long)cVar15 + -1];
      iVar19 = sqlite3PagerWrite(pMVar53->pDbPage);
      pvVar24 = local_268;
      if ((iVar19 == 0) &&
         ((local_2a1 = cVar15, local_2a0 = (MemPage *)(ulong)uVar18, -1 < pMVar53->nFree ||
          (iVar19 = btreeComputeFreeSpace(pMVar53), pvVar24 = local_268, iVar19 == 0)))) {
        local_280 = pMVar53;
        if ((pPage->intKeyLeaf != '\0') &&
           ((((pPage->nOverflow == '\x01' && (pPage->aiOvfl[0] == pPage->nCell)) &&
             (pMVar53->pgno != 1)) && (pMVar53->nCell == (u16)local_2a0)))) {
          if (pPage->aiOvfl[0] == 0) {
            iVar19 = sqlite3CorruptError(0x12304);
            pvVar24 = local_268;
          }
          else {
            pBVar9 = pPage->pBt;
            iVar19 = allocateBtreePage(pBVar9,&pNew,&pgnoNew,0,'\0');
            pvVar24 = local_268;
            if (iVar19 == 0) {
              apOld[0] = (MemPage *)pPage->apOvfl[0];
              szCell = (*pPage->xCellSize)(pPage,(u8 *)apOld[0]);
              pMVar53 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
              zeroPage(pMVar53,0xd);
              pChild = (MemPage *)CONCAT44(pChild._4_4_,1);
              local_148 = (MemPage *)apOld;
              pMStack_140 = (MemPage *)&szCell;
              local_138 = (MemPage *)pPage->aDataEnd;
              local_108[0] = 2;
              pMStack_150 = pPage;
              iVar19 = rebuildPage((CellArray *)&pChild,0,1,pMVar53);
              local_1a0.nKey = CONCAT44(local_1a0.nKey._4_4_,iVar19);
              if (iVar19 == 0) {
                pMVar53->nFree =
                     (pBVar9->usableSize - ((uint)szCell + (uint)pMVar53->cellOffset)) + -2;
                if ((pBVar9->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar9,pgnoNew,'\x05',local_280->pgno,(int *)&local_1a0),
                   pMVar53->minLocal < szCell)) {
                  ptrmapPutOvflPtr(pMVar53,pMVar53,&apOld[0]->isInit,(int *)&local_1a0);
                }
                uVar39 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                          pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                pPage->maskPage);
                uVar41 = 0;
                puVar10 = pPage->aData + uVar39;
                pMVar38 = (MemPage *)(pPage->aData + uVar39 + 2);
                do {
                  pMVar35 = pMVar38;
                  puVar50 = puVar10;
                  if (7 < uVar41) break;
                  uVar41 = uVar41 + 1;
                  puVar10 = puVar50 + 1;
                  pMVar38 = (MemPage *)&pMVar35->intKey;
                } while ((char)*puVar50 < '\0');
                lVar28 = 4;
                do {
                  apOld[0] = pMVar35;
                  uVar4 = *(u8 *)((long)&apOld[0][-1].xParseCell + 7);
                  aBalanceQuickSpace[lVar28] = uVar4;
                  lVar28 = lVar28 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar35 = (MemPage *)&apOld[0]->intKey;
                } while (apOld[0] < (MemPage *)(puVar50 + 10));
                if ((int)local_1a0.nKey == 0) {
                  insertCell(local_280,(uint)local_280->nCell,aBalanceQuickSpace,(int)lVar28,
                             (u8 *)0x0,pPage->pgno,(int *)&local_1a0);
                }
                *(Pgno *)(local_280->aData + (ulong)local_280->hdrOffset + 8) =
                     pgnoNew >> 0x18 | (pgnoNew & 0xff0000) >> 8 | (pgnoNew & 0xff00) << 8 |
                     pgnoNew << 0x18;
                iVar19 = (int)local_1a0.nKey;
              }
              releasePage(pMVar53);
              pvVar24 = local_268;
            }
          }
          goto LAB_00140af3;
        }
        pvVar24 = pcache1Alloc(pCur->pBt->pageSize);
        local_2dc = 0;
        abDone[0] = '\0';
        abDone[1] = '\0';
        abDone[2] = '\0';
        abDone[3] = '\0';
        abDone[4] = '\0';
        pChild = (MemPage *)0x0;
        pMStack_150 = (MemPage *)0x0;
        local_148 = (MemPage *)0x0;
        pMStack_140 = (MemPage *)0x0;
        local_138 = (MemPage *)0x0;
        puStack_130 = (u8 *)0x0;
        local_128 = (u8 *)0x0;
        puStack_120 = (u8 *)0x0;
        local_108[4] = 0;
        local_108[5] = 0;
        local_118 = (u8 *)0x0;
        puStack_110 = (u8 *)0x0;
        local_108[0] = 0;
        local_108[1] = 0;
        local_108[2] = 0;
        local_108[3] = 0;
        iVar19 = 7;
        if (pvVar24 != (void *)0x0) {
          uVar44 = pCur->hints & 1;
          uVar36 = (uint)pMVar53->nCell + (uint)pMVar53->nOverflow;
          local_2b8 = 0;
          if (1 < uVar36) {
            uVar31 = (uint)local_2a0;
            if (uVar31 == 0) {
              local_2b8 = 0;
            }
            else {
              if (uVar36 == uVar31) {
                uVar31 = (uVar31 + uVar44) - 2;
              }
              else {
                uVar31 = uVar31 - 1;
              }
              local_2b8 = (ulong)uVar31;
            }
            uVar36 = 2 - uVar44;
          }
          pMVar38 = (MemPage *)(ulong)uVar36;
          uVar31 = ((int)local_2b8 - (uint)pMVar53->nOverflow) + uVar36;
          puVar10 = pMVar53->aData;
          if (uVar31 == pMVar53->nCell) {
            uVar39 = (ulong)pMVar53->hdrOffset + 8;
          }
          else {
            uVar39 = (ulong)(CONCAT11(pMVar53->aCellIdx[(long)(int)uVar31 * 2],
                                      pMVar53->aCellIdx[(long)(int)uVar31 * 2 + 1]) &
                            pMVar53->maskPage);
          }
          local_278 = pMVar53->pBt;
          local_298 = (MemPage *)CONCAT44(local_298._4_4_,uVar36 + 1);
          uVar20 = sqlite3Get4byte(puVar10 + uVar39);
          local_2d0 = CONCAT44(local_2d0._4_4_,uVar20);
          __n = (size_t)(uVar36 * 8);
          uVar31 = (int)local_2b8 + -1 + uVar36;
          local_288 = (MemPage *)(szNew + (long)((long)&pMVar38[-1].xParseCell + 7));
          iVar19 = 0;
          iVar48 = 0;
          local_2b0 = pMVar38;
          while (pMVar35 = (MemPage *)((ulong)local_298 & 0xffffffff), iVar19 == 0) {
            local_2dc = getAndInitPage(local_278,(Pgno)local_2d0,(MemPage **)((long)apOld + __n),
                                       (BtCursor *)0x0,0);
            if (local_2dc != 0) break;
            pMVar25 = *(MemPage **)((long)apOld + __n);
            if ((pMVar25->nFree < 0) && (local_2dc = btreeComputeFreeSpace(pMVar25), local_2dc != 0)
               ) goto LAB_00140a5b;
            iVar19 = iVar48 + (uint)pMVar25->nCell;
            iVar48 = iVar19 + 4;
            if (__n == 0) {
              local_25c = (Pgno)local_2d0;
              uVar46 = iVar19 + 7;
              uVar31 = uVar46 & 0x7ffffffc;
              pMVar25 = (MemPage *)sqlite3Malloc((long)(int)(uVar31 * 10 + local_278->pageSize));
              pMVar53 = apOld[0];
              local_148 = pMVar25;
              if (pMVar25 == (MemPage *)0x0) {
                local_2dc = 7;
                goto LAB_00140e5b;
              }
              local_290 = (MemPage *)(pMVar25->aiOvfl + (ulong)uVar31 * 4 + -0xe);
              pMStack_140 = local_290;
              local_270 = (MemPage *)(local_290->aiOvfl + ((ulong)uVar31 - 0xe));
              pMStack_150 = apOld[0];
              bVar2 = apOld[0]->leaf;
              local_2c0 = (MemPage *)((ulong)bVar2 << 2);
              local_2d0 = (ulong)apOld[0]->intKeyLeaf;
              pMVar45 = (MemPage *)0x0;
              iVar19 = 0;
              local_238 = 0;
              local_2c8 = pMVar35;
              goto LAB_00140bef;
            }
            local_2b0 = (MemPage *)((long)&local_2b0[-1].xParseCell + 7);
            uVar46 = uVar31;
            if (pMVar53->nOverflow == 0) {
LAB_0014097d:
              local_2c8 = (MemPage *)CONCAT44(local_2c8._4_4_,uVar31);
              lVar28 = (long)(int)(uVar46 - pMVar53->nOverflow);
              puVar50 = pMVar53->aData +
                        (CONCAT11(pMVar53->aCellIdx[lVar28 * 2],pMVar53->aCellIdx[lVar28 * 2 + 1]) &
                        pMVar53->maskPage);
              *(u8 **)((long)&lStack_b0 + __n) = puVar50;
              uVar20 = sqlite3Get4byte(puVar50);
              local_2d0 = CONCAT44(local_2d0._4_4_,uVar20);
              uVar16 = (*pMVar53->xCellSize)(pMVar53,puVar50);
              uVar31 = (uint)uVar16;
              local_288->isInit = (char)uVar31;
              local_288->intKey = (char)(uVar31 >> 8);
              local_288->intKeyLeaf = (char)(uVar31 >> 0x10);
              local_288->field_0x3 = (char)(uVar31 >> 0x18);
              if (((local_278->btsFlags & 0xc) != 0) &&
                 (iVar19 = (int)puVar50 - *(int *)&pMVar53->aData,
                 (int)(iVar19 + (uint)uVar16) <= (int)local_278->usableSize)) {
                memcpy((void *)((long)iVar19 + (long)pvVar24),puVar50,(ulong)uVar31);
                *(long *)((long)&lStack_b0 + __n) =
                     ((long)puVar50 - (long)pMVar53->aData) + (long)pvVar24;
              }
              dropCell(pMVar53,uVar46 - pMVar53->nOverflow,(uint)uVar16,&local_2dc);
              iVar19 = local_2dc;
              uVar31 = (uint)local_2c8;
            }
            else {
              if (uVar31 != pMVar53->aiOvfl[0]) {
                uVar46 = (int)local_2b8 + (int)local_2b0;
                goto LAB_0014097d;
              }
              puVar50 = pMVar53->apOvfl[0];
              *(u8 **)((long)&lStack_b0 + __n) = puVar50;
              uVar20 = sqlite3Get4byte(puVar50);
              local_2d0 = CONCAT44(local_2d0._4_4_,uVar20);
              uVar16 = (*pMVar53->xCellSize)(pMVar53,puVar50);
              uVar46 = (uint)uVar16;
              local_288->isInit = (char)uVar46;
              local_288->intKey = (char)(uVar46 >> 8);
              local_288->intKeyLeaf = (char)(uVar46 >> 0x10);
              local_288->field_0x3 = (char)(uVar46 >> 0x18);
              pMVar53->nOverflow = '\0';
              iVar19 = 0;
            }
            __n = __n - 8;
            uVar31 = uVar31 - 1;
            local_288 = (MemPage *)((long)&local_288[-1].xParseCell + 4);
          }
          __n = __n + 8;
LAB_00140a5b:
          memset(apOld,0,__n);
          uVar44 = 0;
          iVar19 = local_2dc;
          goto LAB_00140a70;
        }
        goto LAB_00140ad1;
      }
      goto LAB_00140af3;
    }
  }
  else {
    cVar15 = pCur->iPage;
    if (cVar15 != '\0') goto LAB_0014049a;
    ppBVar23 = &pCur->pBt->pCursor;
    while (pBVar8 = *ppBVar23, pBVar8 != (BtCursor *)0x0) {
      if (((pBVar8 != pCur) && (pBVar8->eState == '\0')) && (pBVar8->pPage == pCur->pPage)) {
        iVar19 = sqlite3CorruptError(0x12745);
        goto LAB_00141fb8;
      }
      ppBVar23 = &pBVar8->pNext;
    }
    pChild = (MemPage *)0x0;
    apOld[0] = (MemPage *)((ulong)apOld[0] & 0xffffffff00000000);
    pBVar9 = pPage->pBt;
    iVar19 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar19 == 0) {
      pNew._0_4_ = allocateBtreePage(pBVar9,&pChild,(Pgno *)apOld,pPage->pgno,'\0');
      pMVar53 = pChild;
      copyNodeContent(pPage,pChild,(int *)&pNew);
      if (pBVar9->autoVacuum != '\0') {
        ptrmapPut(pBVar9,(Pgno)apOld[0],'\x05',pPage->pgno,(int *)&pNew);
      }
      iVar19 = (int)pNew;
      if ((int)pNew != 0) goto LAB_00141fa0;
      memcpy(pMVar53->aiOvfl,pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
      memcpy(pMVar53->apOvfl,pPage->apOvfl,(ulong)pPage->nOverflow << 3);
      pMVar53->nOverflow = pPage->nOverflow;
      zeroPage(pPage,*pMVar53->aData & 0xfffffff7);
      *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
           (Pgno)apOld[0] >> 0x18 | ((Pgno)apOld[0] & 0xff0000) >> 8 |
           ((Pgno)apOld[0] & 0xff00) << 8 | (Pgno)apOld[0] << 0x18;
      pCur->apPage[1] = pMVar53;
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      pCur->apPage[0] = pPage;
      iVar19 = 0;
      goto LAB_00140b14;
    }
    pMVar53 = (MemPage *)0x0;
LAB_00141fa0:
    pCur->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar53);
  }
  goto LAB_00141fb8;
LAB_00140bef:
  local_230 = (MemPage *)((ulong)local_2c0 & 0xffff);
  if (pMVar45 == local_2c8) goto LAB_00140e63;
  pMVar35 = apOld[(long)pMVar45];
  puVar50 = pMVar35->aData;
  if (*puVar50 != *pMVar53->aData) {
    iVar19 = 0x124ab;
    goto LAB_0014110e;
  }
  local_2d8 = (MemPage *)(ulong)pMVar35->nCell;
  uVar18 = pMVar35->maskPage;
  puVar51 = puVar50 + pMVar35->cellOffset;
  uVar41 = (ulong)iVar19;
  local_2b0 = pMVar45;
  local_288 = pMVar35;
  memset(local_290->aiOvfl + (uVar41 - 0xe),0,
         (ulong)(((uint)pMVar35->nCell + (uint)pMVar35->nOverflow) * 2));
  pMVar45 = local_2b0;
  bVar3 = local_288->nOverflow;
  if ((ulong)bVar3 != 0) {
    uVar31 = (uint)local_288->aiOvfl[0];
    if ((ushort)local_2d8 < local_288->aiOvfl[0]) {
      iVar19 = 0x124c3;
LAB_0014110e:
      iVar19 = sqlite3CorruptError(iVar19);
      pMVar35 = local_2c8;
      uVar44 = 0;
      goto LAB_00140a70;
    }
    lVar28 = uVar41 << 0x20;
    puVar32 = pMVar25->aiOvfl + uVar41 * 4 + -0xe;
    while (bVar54 = uVar31 != 0, uVar31 = uVar31 - 1, bVar54) {
      *(u8 **)(pMVar25->aiOvfl + uVar41 * 4 + -0xe) =
           puVar50 + (CONCAT11(*puVar51,puVar51[1]) & uVar18);
      puVar51 = puVar51 + 2;
      uVar41 = uVar41 + 1;
      lVar28 = lVar28 + 0x100000000;
      iVar19 = iVar19 + 1;
      puVar32 = puVar32 + 4;
    }
    for (uVar41 = 0; bVar3 != uVar41; uVar41 = uVar41 + 1) {
      *(u8 **)puVar32 = local_288->apOvfl[uVar41];
      lVar28 = lVar28 + 0x100000000;
      iVar19 = iVar19 + 1;
      puVar32 = puVar32 + 4;
    }
    pChild = (MemPage *)CONCAT44(pChild._4_4_,iVar19);
    uVar41 = lVar28 >> 0x20;
  }
  uVar5 = local_288->cellOffset;
  uVar6 = local_288->nCell;
  lVar28 = uVar41 << 0x20;
  for (; puVar51 < puVar50 + (ulong)uVar6 * 2 + (ulong)uVar5; puVar51 = puVar51 + 2) {
    *(u8 **)(pMVar25->aiOvfl + uVar41 * 4 + -0xe) =
         puVar50 + (uVar18 & CONCAT11(*puVar51,puVar51[1]));
    uVar41 = uVar41 + 1;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,(int)uVar41);
    lVar28 = lVar28 + 0x100000000;
  }
  *(int *)(&szCell + (long)local_2b0 * 2) = (int)uVar41;
  if ((local_2b0 < pMVar38) && ((char)local_2d0 == '\0')) {
    uVar31 = szNew[(long)local_2b0] & 0xffff;
    lVar49 = lVar28 >> 0x1f;
    *(short *)((long)local_290->aiOvfl + lVar49 + -0x1c) = (short)szNew[(long)local_2b0];
    local_2d8 = (MemPage *)((long)local_270->aiOvfl + (long)(int)local_238 + -0x1c);
    uVar37 = (int)local_238 + uVar31;
    uVar26 = (ulong)uVar37;
    memcpy(local_2d8,apDiv[(long)local_2b0],(ulong)uVar31);
    puVar33 = (undefined4 *)((long)local_2d8->aiOvfl + (long)((long)&local_2c0[-1].aDataOfst + 4));
    *(undefined4 **)((long)pMVar25->aiOvfl + (lVar28 >> 0x1d) + -0x1c) = puVar33;
    local_230._0_4_ = (uint)*(ushort *)((long)local_290->aiOvfl + lVar49 + -0x1c) - (int)local_230;
    *(short *)((long)local_290->aiOvfl + lVar49 + -0x1c) = (short)(int)local_230;
    if (local_288->leaf == '\0') {
      *puVar33 = *(undefined4 *)(local_288->aData + 8);
    }
    else {
      puVar27 = (undefined1 *)
                ((long)pMVar25->aiOvfl +
                (long)(int)uVar37 + (ulong)(uVar46 >> 2 & 0x1fffffff) * 0x28 + -0x1c);
      while ((ushort)(int)local_230 < 4) {
        *puVar27 = 0;
        local_230._0_4_ = local_290->aiOvfl[(lVar28 >> 0x20) + -0xe] + 1;
        local_290->aiOvfl[(lVar28 >> 0x20) + -0xe] = (u16)(int)local_230;
        uVar26 = (ulong)((int)uVar26 + 1);
        puVar27 = puVar27 + 1;
      }
    }
    local_238 = uVar26;
    uVar31 = (int)uVar41 + 1;
    uVar41 = (ulong)uVar31;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,uVar31);
  }
  pMVar45 = (MemPage *)&pMVar45->intKey;
  iVar19 = (int)uVar41;
  goto LAB_00140bef;
LAB_00140e63:
  local_288 = (MemPage *)
              CONCAT44(local_288._4_4_,local_278->usableSize + (uint)(ushort)local_2c0 + -0xc);
  iVar19 = 0;
  for (pMVar35 = (MemPage *)0x0; pMVar35 != local_2c8; pMVar35 = (MemPage *)&pMVar35->intKey) {
    pMVar25 = apOld[(long)pMVar35];
    (&pMStack_140)[(long)iVar19 + 1] = (MemPage *)pMVar25->aDataEnd;
    PVar40 = *(Pgno *)(&szCell + (long)pMVar35 * 2);
    local_108[iVar19] = PVar40;
    if (iVar19 == 0) {
      iVar48 = 0;
    }
    else {
      iVar48 = iVar19 + -1;
      if (PVar40 != local_108[(long)iVar19 + -1]) {
        iVar48 = iVar19;
      }
    }
    iVar19 = iVar48;
    if ((Pgno)local_2d0 == 0) {
      iVar19 = iVar48 + 1;
      (&pMStack_140)[(long)iVar48 + 2] = (MemPage *)local_280->aDataEnd;
      local_108[(long)iVar48 + 1] = PVar40 + 1;
    }
    iVar48 = (int)local_288 - pMVar25->nFree;
    szNew[(long)pMVar35] = iVar48;
    for (uVar41 = 0; uVar41 < pMVar25->nOverflow; uVar41 = uVar41 + 1) {
      uVar16 = (*pMVar25->xCellSize)(pMVar25,pMVar25->apOvfl[uVar41]);
      iVar48 = iVar48 + (uint)uVar16 + 2;
      szNew[(long)pMVar35] = iVar48;
    }
    local_254[(long)((long)&pMVar35[-1].xParseCell + 7)] = PVar40;
    iVar19 = iVar19 + 1;
  }
  local_2b0 = (MemPage *)CONCAT44(local_2b0._4_4_,pChild._0_4_);
  pMVar25 = (MemPage *)((ulong)local_298 & 0xffffffff);
  pMVar35 = (MemPage *)0x0;
LAB_00140f5d:
  do {
    if ((long)(int)pMVar25 <= (long)pMVar35) {
      uVar26 = (ulong)((int)pMVar25 - 1);
      local_2c0 = pMStack_140;
      local_2d8 = (MemPage *)((long)pMStack_140 - (ulong)(uint)((int)local_2d0 * 2));
      uVar41 = uVar26;
      local_270 = pMVar25;
      break;
    }
    iVar19 = szNew[(long)pMVar35];
    local_2c0 = (MemPage *)&pMVar35->intKey;
    local_2d8 = (MemPage *)CONCAT44(local_2d8._4_4_,(int)pMVar35 + 2);
    for (; (int)local_288 < iVar19; iVar19 = iVar19 - (uVar16 + 2)) {
      if ((int)pMVar25 <= (int)local_2c0) {
        if ((MemPage *)0x3 < pMVar35) {
          szNew[(long)pMVar35] = iVar19;
          iVar19 = 0x12528;
          goto LAB_0014110e;
        }
        szNew[(long)&pMVar35->intKey] = 0;
        local_254[(long)pMVar35] = (Pgno)local_2b0;
        pMVar25 = (MemPage *)((ulong)local_2d8 & 0xffffffff);
      }
      PVar40 = local_254[(long)((long)&pMVar35[-1].xParseCell + 7)];
      uVar16 = cachedCellSize((CellArray *)&pChild,PVar40 - 1);
      iVar48 = uVar16 + 2;
      if ((Pgno)local_2d0 == 0) {
        iVar48 = 0;
        if ((int)PVar40 < (int)(Pgno)local_2b0) {
          uVar17 = cachedCellSize((CellArray *)&pChild,PVar40);
          iVar48 = uVar17 + 2;
        }
      }
      szNew[(long)&pMVar35->intKey] = szNew[(long)&pMVar35->intKey] + iVar48;
      local_254[(long)((long)&pMVar35[-1].xParseCell + 7)] = PVar40 - 1;
    }
    szNew[(long)pMVar35] = iVar19;
    PVar40 = local_254[(long)((long)&pMVar35[-1].xParseCell + 7)];
    while ((int)PVar40 < (int)(Pgno)local_2b0) {
      uVar18 = cachedCellSize((CellArray *)&pChild,PVar40);
      iVar19 = iVar19 + (uint)uVar18 + 2;
      if ((int)local_288 < iVar19) {
        local_254[(long)((long)&pMVar35[-1].xParseCell + 7)] = PVar40;
        if (pMVar35 == (MemPage *)0x0) {
          PVar21 = 0;
        }
        else {
          PVar21 = (&local_25c)[(long)pMVar35];
        }
        pMVar35 = local_2c0;
        if ((int)PVar21 < (int)PVar40) goto LAB_00140f5d;
        iVar19 = 0x12549;
        goto LAB_001412a7;
      }
      PVar40 = PVar40 + 1;
      szNew[(long)pMVar35] = iVar19;
      if ((Pgno)local_2d0 == 0) {
        iVar48 = 0;
        if ((int)PVar40 < (int)(Pgno)local_2b0) {
          uVar18 = cachedCellSize((CellArray *)&pChild,PVar40);
          goto LAB_0014107c;
        }
      }
      else {
LAB_0014107c:
        iVar48 = uVar18 + 2;
      }
      szNew[(long)&pMVar35->intKey] = szNew[(long)&pMVar35->intKey] - iVar48;
    }
    local_254[(long)((long)&pMVar35[-1].xParseCell + 7)] = PVar40;
    pMVar25 = (MemPage *)((ulong)local_2c0 & 0xffffffff);
    pMVar35 = local_2c0;
  } while( true );
  do {
    pMVar35 = local_2c8;
    local_1d8 = (char)uVar44;
    if ((int)uVar41 < 1) {
      local_2d8 = (MemPage *)CONCAT44(local_2d8._4_4_,(uint)*pMVar53->aData);
      local_2a0 = (MemPage *)(ulong)(uint)((int)local_2a0 - (int)local_2b8);
      pMVar53 = (MemPage *)0x0;
      iVar19 = (int)local_270;
      local_270 = (MemPage *)((ulong)local_270 & 0xffffffff);
      if (iVar19 < 1) {
        local_270 = pMVar53;
      }
      uVar31 = 0;
      goto LAB_00141444;
    }
    iVar19 = szNew[uVar41 - 1];
    iVar48 = szNew[uVar41];
    uVar52 = (ulong)(int)(&local_25c)[uVar41];
    cachedCellSize((CellArray *)&pChild,(&local_25c)[uVar41] - (Pgno)local_2d0);
    local_290 = (MemPage *)(ulong)((uint)(uVar41 == uVar26) * 2 - 2);
    lVar28 = uVar52 + 1;
    local_238 = uVar41;
    do {
      uVar31 = (uint)uVar52;
      uVar46 = uVar31 - 1;
      cachedCellSize((CellArray *)&pChild,uVar46);
      if (iVar48 == 0) {
        uVar18 = local_2c0->aiOvfl[lVar28 + -0x10];
        iVar22 = local_2d8->aiOvfl[lVar28 + -0xf] + 2;
      }
      else {
        if (local_1d8 != '\0') break;
        iVar22 = (uint)local_2d8->aiOvfl[lVar28 + -0xf] + iVar48 + 2;
        uVar18 = local_2c0->aiOvfl[lVar28 + -0x10];
        if ((int)(((int)local_290 + iVar19) - (uint)uVar18) < iVar22) break;
      }
      iVar19 = (iVar19 - (uint)uVar18) + -2;
      local_254[uVar41 - 2] = uVar46;
      lVar28 = lVar28 + -1;
      uVar52 = (ulong)uVar46;
      uVar31 = uVar46;
      iVar48 = iVar22;
    } while (1 < lVar28);
    szNew[local_238] = iVar48;
    szNew[uVar41 - 1] = iVar19;
    PVar40 = 0;
    if (local_238 != 1) {
      PVar40 = local_254[(ulong)((int)local_238 - 2) - 1];
    }
    uVar41 = uVar41 - 1;
  } while ((int)PVar40 < (int)uVar31);
  iVar19 = 0x12573;
LAB_001412a7:
  pMVar35 = local_2c8;
  local_2dc = sqlite3CorruptError(iVar19);
LAB_00140e5b:
  uVar44 = 0;
  iVar19 = local_2dc;
  goto LAB_00140a70;
LAB_00141444:
  pBVar9 = local_278;
  pMVar25 = local_2a0;
  uVar44 = uVar31;
  if (local_270 == pMVar53) goto LAB_0014155d;
  if (pMVar53 <= pMVar38) {
    pMVar45 = apOld[(long)pMVar53];
    local_180[(long)((long)&pMVar53[-1].xParseCell + 7)] = pMVar45;
    apOld[(long)pMVar53] = (MemPage *)0x0;
    local_2dc = sqlite3PagerWrite(pMVar45->pDbPage);
    if (((pMVar25 == pMVar53) + 1 == (int)pMVar45->pDbPage->nRef) || (local_2dc != 0))
    goto LAB_0014153e;
    iVar19 = 0x12594;
    uVar31 = uVar31 + 1;
LAB_001415c3:
    iVar19 = sqlite3CorruptError(iVar19);
    uVar44 = uVar31;
    goto LAB_00140a70;
  }
  PVar40 = 1;
  if (local_1d8 == '\0') {
    PVar40 = local_25c;
  }
  local_2dc = allocateBtreePage(local_278,(MemPage **)&local_1a0,&local_25c,PVar40,'\0');
  iVar14 = local_1a0.nKey;
  iVar19 = local_2dc;
  if (local_2dc != 0) goto LAB_00140a70;
  zeroPage((MemPage *)local_1a0.nKey,(int)local_2d8);
  local_180[(long)((long)&pMVar53[-1].xParseCell + 7)] = (MemPage *)iVar14;
  *(Pgno *)(&szCell + (long)pMVar53 * 2) = (Pgno)local_2b0;
  if (pBVar9->autoVacuum == '\0') goto LAB_00141549;
  ptrmapPut(pBVar9,*(Pgno *)(iVar14 + 4),'\x05',local_280->pgno,&local_2dc);
LAB_0014153e:
  uVar44 = uVar31 + 1;
  iVar19 = local_2dc;
  if (local_2dc != 0) goto LAB_00140a70;
LAB_00141549:
  uVar31 = uVar31 + 1;
  pMVar53 = (MemPage *)&pMVar53->intKey;
  goto LAB_00141444;
LAB_0014155d:
  uVar41 = 0;
  if (0 < (int)uVar31) {
    uVar41 = (ulong)uVar31;
  }
  for (uVar26 = 0; uVar26 != uVar41; uVar26 = uVar26 + 1) {
    pMVar53 = local_180[uVar26 - 1];
    PVar40 = pMVar53->pgno;
    aPgno[uVar26] = PVar40;
    aPgOrder[uVar26] = PVar40;
    aPgFlags[uVar26] = pMVar53->pDbPage->flags;
    uVar52 = 0;
    while (uVar26 != uVar52) {
      pPVar1 = aPgno + uVar52;
      uVar52 = uVar52 + 1;
      if (*pPVar1 == PVar40) {
        iVar19 = 0x125c2;
        goto LAB_001415c3;
      }
    }
  }
  PVar40 = local_25c;
  for (uVar26 = 0; uVar26 != uVar41; uVar26 = uVar26 + 1) {
    uVar46 = 0;
    for (uVar52 = 1; lVar28 = (long)(int)uVar46, uVar31 != uVar52; uVar52 = uVar52 + 1) {
      uVar37 = (uint)uVar52;
      if (aPgOrder[lVar28] <= aPgOrder[uVar52]) {
        uVar37 = uVar46;
      }
      uVar46 = uVar37;
    }
    PVar40 = aPgOrder[lVar28];
    aPgOrder[lVar28] = 0xffffffff;
    if (uVar26 != uVar46) {
      if ((long)uVar26 < lVar28) {
        pPVar11 = local_180[lVar28 + -1]->pDbPage;
        uVar20 = local_278->nPage;
        pPVar11->flags = 0;
        sqlite3PcacheMove(pPVar11,uVar20 + uVar46 + 1);
      }
      pMVar53 = local_180[uVar26 - 1];
      pPVar11 = pMVar53->pDbPage;
      pPVar11->flags = aPgFlags[lVar28];
      sqlite3PcacheMove(pPVar11,PVar40);
      pMVar53->pgno = PVar40;
    }
  }
  local_25c = PVar40;
  lVar49 = (long)(int)uVar31;
  lVar28 = *(long *)(&local_1a0.nPayload + lVar49 * 2);
  uVar46 = *(uint *)(lVar28 + 4);
  *(uint *)(puVar10 + uVar39) =
       uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8 | uVar46 << 0x18;
  if ((((ulong)local_2d8 & 8) == 0) && ((uint)local_298 != uVar31)) {
    ppMVar29 = apOld;
    if ((int)(uint)local_298 < (int)uVar31) {
      ppMVar29 = &pNew;
    }
    *(undefined4 *)(*(long *)(lVar28 + 0x50) + 8) =
         *(undefined4 *)(ppMVar29[(long)pMVar38]->aData + 8);
  }
  if (local_278->autoVacuum != '\0') {
    bVar54 = (Pgno)local_2d0 == 0;
    pMVar53 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
    pMVar25 = (MemPage *)(ulong)((uint)pMVar53->nOverflow + (uint)pMVar53->nCell);
    local_2d8 = (MemPage *)((ulong)local_2d8 & 0xffffffff00000000);
    lVar28 = 0;
    local_298 = pMVar53;
    for (local_2c0 = (MemPage *)0x0; (long)local_2c0 < (long)(int)(Pgno)local_2b0;
        local_2c0 = (MemPage *)&local_2c0->intKey) {
      pMVar35 = *(MemPage **)(local_148->aiOvfl + (long)local_2c0 * 4 + -0xe);
      lVar42 = (long)(int)lVar28;
      lVar28 = lVar28 << 0x20;
      ppMVar29 = apOld + lVar42 + 1;
      ppMVar34 = local_180 + lVar42;
      for (; local_2c0 == pMVar25;
          pMVar25 = (MemPage *)
                    (ulong)((int)pMVar25 + (uint)bVar54 + (uint)pMVar53->nCell +
                           (uint)pMVar53->nOverflow)) {
        lVar42 = lVar42 + 1;
        ppMVar43 = ppMVar29;
        if (lVar42 < lVar49) {
          ppMVar43 = ppMVar34;
        }
        pMVar53 = *ppMVar43;
        lVar28 = lVar28 + 0x100000000;
        ppMVar29 = ppMVar29 + 1;
        ppMVar34 = ppMVar34 + 1;
      }
      lVar30 = (long)(int)local_2d8;
      if (local_2c0 == (MemPage *)(ulong)local_254[lVar30 + -1]) {
        local_2d8 = (MemPage *)CONCAT44(local_2d8._4_4_,(int)local_2d8 + 1);
        local_298 = local_180[lVar30];
        if ((Pgno)local_2d0 != 0) goto LAB_001417de;
      }
      else {
LAB_001417de:
        if (((((int)uVar31 <= (int)lVar42) ||
             (local_298->pgno != *(Pgno *)((long)aPgno + (lVar28 >> 0x1e)))) ||
            (pMVar35 < (MemPage *)pMVar53->aData)) || ((MemPage *)pMVar53->aDataEnd <= pMVar35)) {
          local_2b0 = pMVar35;
          if (bVar2 == 0) {
            uVar20 = sqlite3Get4byte(&pMVar35->isInit);
            ptrmapPut(local_278,uVar20,'\x05',local_298->pgno,&local_2dc);
          }
          uVar16 = cachedCellSize((CellArray *)&pChild,(int)local_2c0);
          if (local_298->minLocal < uVar16) {
            ptrmapPutOvflPtr(local_298,pMVar53,&local_2b0->isInit,&local_2dc);
          }
          pMVar35 = local_2c8;
          iVar19 = local_2dc;
          if (local_2dc != 0) goto LAB_00140a70;
          local_2b0 = (MemPage *)CONCAT44(local_2b0._4_4_,pChild._0_4_);
        }
      }
      lVar28 = lVar42;
    }
    local_2c0 = pMStack_140;
  }
  local_298 = local_148;
  pMVar53 = (MemPage *)0x0;
  local_290 = (MemPage *)(ulong)(uVar31 - 1);
  if ((int)(uVar31 - 1) < 1) {
    local_290 = pMVar53;
  }
  iVar48 = 0;
  do {
    pMVar25 = pMStack_150;
    if (pMVar53 == local_290) {
      bVar54 = (Pgno)local_2d0 == 0;
      uVar46 = -uVar31;
      local_15c = pgnoNew;
      goto LAB_00141a53;
    }
    pMVar35 = local_180[(long)((long)&pMVar53[-1].xParseCell + 7)];
    PVar40 = local_254[(long)((long)&pMVar53[-1].xParseCell + 7)];
    lVar28 = (long)(int)PVar40;
    pMVar25 = *(MemPage **)(local_298->aiOvfl + lVar28 * 4 + -0xe);
    uVar46 = (int)local_230 + (uint)local_2c0->aiOvfl[lVar28 + -0xe];
    pMVar45 = (MemPage *)((long)iVar48 + (long)pvVar24);
    if (pMVar35->leaf == '\0') {
      puVar10 = pMVar35->aData;
      uVar4 = pMVar25->intKey;
      uVar12 = pMVar25->intKeyLeaf;
      uVar13 = pMVar25->field_0x3;
      puVar10[8] = pMVar25->isInit;
      puVar10[9] = uVar4;
      puVar10[10] = uVar12;
      puVar10[0xb] = uVar13;
    }
    else if ((Pgno)local_2d0 == 0) {
      pMVar25 = (MemPage *)((long)&pMVar25[-1].xParseCell + 4);
      if (local_2c0->aiOvfl[lVar28 + -0xe] == 4) {
        local_2d8 = pMVar35;
        local_2a0 = pMVar45;
        uVar16 = (*local_280->xCellSize)(local_280,(u8 *)pMVar25);
        uVar46 = (uint)uVar16;
        pMVar45 = local_2a0;
        pMVar35 = local_2d8;
      }
    }
    else {
      PVar40 = PVar40 - 1;
      local_2d8 = pMVar35;
      local_2a0 = pMVar45;
      (*pMVar35->xParseCell)(pMVar35,*(u8 **)(local_298->aiOvfl + lVar28 * 4 + -0x12),&local_1a0);
      iVar19 = sqlite3PutVarint((uchar *)&pMVar45->pgno,local_1a0.nKey);
      uVar46 = iVar19 + 4;
      pMVar25 = local_2a0;
      pMVar45 = (MemPage *)0x0;
      pMVar35 = local_2d8;
    }
    uVar39 = 0;
    do {
      uVar26 = uVar39 + 1;
      if (5 < uVar39) break;
      pPVar1 = local_108 + uVar39;
      uVar39 = uVar26;
    } while ((int)*pPVar1 <= (int)PVar40);
    if ((pMVar25 <= (&pMStack_140)[uVar26]) &&
       ((&pMStack_140)[uVar26] < (MemPage *)((long)pMVar25->aiOvfl + (long)(int)uVar46 + -0x1c))) {
      iVar19 = 0x1265f;
      goto LAB_00141e86;
    }
    iVar48 = iVar48 + uVar46;
    insertCell(local_280,(int)local_2b8 + (int)pMVar53,&pMVar25->isInit,uVar46,&pMVar45->isInit,
               pMVar35->pgno,&local_2dc);
    pMVar53 = (MemPage *)&pMVar53->intKey;
    pMVar35 = local_2c8;
    iVar19 = local_2dc;
  } while (local_2dc == 0);
LAB_00140a70:
  local_2dc = iVar19;
  sqlite3DbFree((sqlite3 *)0x0,local_148);
  for (pMVar53 = (MemPage *)0x0; pMVar35 != pMVar53; pMVar53 = (MemPage *)&pMVar53->intKey) {
    releasePage(apOld[(long)pMVar53]);
  }
  if ((int)uVar44 < 1) {
    uVar44 = 0;
  }
  for (uVar39 = 0; iVar19 = local_2dc, uVar44 != uVar39; uVar39 = uVar39 + 1) {
    releasePage(local_180[uVar39 - 1]);
  }
LAB_00140ad1:
  if (local_268 != (void *)0x0) {
    pcache1Free(local_268);
  }
LAB_00140af3:
  local_268 = pvVar24;
  pPage->nOverflow = '\0';
  releasePage(pPage);
  cVar15 = pCur->iPage + -1;
  pCur->iPage = cVar15;
  pMVar53 = pCur->apPage[cVar15];
LAB_00140b14:
  pCur->pPage = pMVar53;
  pPage = pMVar53;
  if (iVar19 != 0) {
LAB_00141fb8:
    if (local_268 != (void *)0x0) {
      pcache1Free(local_268);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
      __stack_chk_fail();
    }
    return iVar19;
  }
  goto LAB_00140416;
LAB_00141a53:
  pBVar9 = local_278;
  uVar46 = uVar46 + 1;
  if ((int)uVar31 <= (int)uVar46) goto LAB_00141e94;
  uVar37 = -uVar46;
  if (0 < (int)uVar46) {
    uVar37 = uVar46;
  }
  pMVar53 = (MemPage *)(ulong)uVar37;
  if (abDone[(long)pMVar53] == '\0') {
    if ((int)uVar46 < 0) {
      if ((&iStack_ec)[(int)uVar37] < (int)(&local_25c)[(int)uVar37]) goto LAB_00141a53;
LAB_00141aaf:
      if (uVar36 < uVar37) {
        uVar39 = (ulong)(uVar37 - 1);
        iVar19 = (Pgno)local_2b0;
      }
      else {
        uVar39 = (ulong)(int)(uVar37 - 1);
        iVar19 = *(int *)(&szCell + uVar39 * 2) + (uint)bVar54;
      }
      uVar37 = local_254[uVar39 - 1] + (uint)bVar54;
      local_2b8 = (ulong)uVar37;
      uVar37 = local_254[(long)((long)&pMVar53[-1].xParseCell + 7)] - uVar37;
    }
    else {
      if (uVar46 != 0) goto LAB_00141aaf;
      local_2b8 = 0;
      iVar19 = 0;
      uVar37 = local_15c;
    }
    local_2d8 = (MemPage *)(ulong)uVar37;
    pMVar35 = local_180[(long)((long)&pMVar53[-1].xParseCell + 7)];
    puVar10 = pMVar35->aData;
    local_238 = (ulong)pMVar35->hdrOffset;
    local_230 = (MemPage *)(pMVar35->aCellIdx + (int)(uVar37 * 2));
    uVar18 = pMVar35->nCell;
    local_2d0 = (ulong)uVar18;
    bVar3 = pMVar35->nOverflow;
    iVar22 = (int)local_2b8;
    local_2a0 = (MemPage *)CONCAT44(local_2a0._4_4_,iVar19);
    iVar48 = iVar19;
    if (iVar19 < iVar22) {
      iVar48 = pageFreeArray(pMVar35,iVar19,iVar22 - iVar19,(CellArray *)&pChild);
      local_2d0 = (ulong)((uint)uVar18 - iVar48);
      if (iVar48 <= (int)(uint)uVar18) {
        memmove(pMVar35->aCellIdx,pMVar35->aCellIdx + iVar48 * 2,
                (ulong)((uint)uVar18 + (uint)uVar18));
        uVar37 = (uint)local_2d8;
        iVar48 = (int)local_2a0;
        goto LAB_00141b97;
      }
      iVar19 = 0x12293;
LAB_00141e86:
      iVar19 = sqlite3CorruptError(iVar19);
      pMVar35 = local_2c8;
      goto LAB_00140a70;
    }
LAB_00141b97:
    iVar47 = (uint)uVar18 + iVar48 + (uint)bVar3;
    iVar48 = uVar37 + (int)local_2b8;
    nCell = iVar47 - iVar48;
    local_270 = pMVar53;
    if (nCell != 0 && iVar48 <= iVar47) {
      iVar48 = pageFreeArray(pMVar35,iVar48,nCell,(CellArray *)&pChild);
      local_2d0 = (ulong)(uint)((int)local_2d0 - iVar48);
    }
    local_1a0.nKey =
         (i64)(puVar10 +
              (ulong)((ushort)(*(ushort *)(puVar10 + local_238 + 5) << 8 |
                              *(ushort *)(puVar10 + local_238 + 5) >> 8) - 1 & 0xffff) + 1);
    local_290 = pMVar35;
    if (((ulong)local_1a0.nKey < local_230) ||
       ((MemPage *)pMVar35->aDataEnd < (ulong)local_1a0.nKey)) {
LAB_00141dab:
      pMVar35 = local_298;
      lVar28 = (long)(int)local_2b8 * 2;
      for (uVar39 = (ulong)local_2d8 & 0xffffffff; pMVar53 = local_290, 0 < (int)uVar39;
          uVar39 = (ulong)((int)uVar39 - 1)) {
        if (*(short *)((long)local_2c0->aiOvfl + lVar28 + -0x1c) == 0) {
          uVar16 = (*pMVar25->xCellSize)(pMVar25,*(u8 **)(pMVar35->aiOvfl + lVar28 * 2 + -0xe));
          *(u16 *)((long)local_2c0->aiOvfl + lVar28 + -0x1c) = uVar16;
        }
        lVar28 = lVar28 + 2;
      }
      iVar19 = rebuildPage((CellArray *)&pChild,(int)local_2b8,(int)local_2d8,local_290);
      pMVar35 = local_2c8;
      if (iVar19 != 0) goto LAB_00140a70;
    }
    else {
      if ((int)local_2b8 < (int)local_2a0) {
        iVar48 = iVar19 - iVar22;
        if ((int)local_2d8 <= iVar19 - iVar22) {
          iVar48 = (int)local_2d8;
        }
        puVar50 = pMVar35->aCellIdx;
        memmove(puVar50 + iVar48 * 2,puVar50,(long)((int)local_2d0 * 2));
        iVar19 = pageInsertArray(pMVar35,&local_230->isInit,(u8 **)&local_1a0,puVar50,(int)local_2b8
                                 ,iVar48,(CellArray *)&pChild);
        if (iVar19 != 0) goto LAB_00141dab;
        local_2d0 = (ulong)(uint)((int)local_2d0 + iVar48);
      }
      uVar52 = 0;
      pMVar35 = local_2d8;
      uVar39 = local_2b8;
      uVar26 = local_2d0;
      pMVar53 = local_290;
      iVar19 = (int)local_2a0;
      while( true ) {
        iVar48 = (int)uVar26;
        if (pMVar53->nOverflow <= uVar52) break;
        iVar47 = (uint)pMVar53->aiOvfl[uVar52] + iVar19;
        iVar22 = iVar47 - (int)uVar39;
        if ((-1 < iVar22) && (iVar22 < (int)pMVar35)) {
          puVar50 = pMVar53->aCellIdx + (uint)(iVar22 * 2);
          local_2d0 = uVar26;
          if (iVar48 - iVar22 != 0 && iVar22 <= iVar48) {
            memmove(puVar50 + 2,puVar50,(long)((iVar48 - iVar22) * 2));
          }
          cachedCellSize((CellArray *)&pChild,iVar47);
          pMVar53 = local_290;
          iVar19 = pageInsertArray(local_290,&local_230->isInit,(u8 **)&local_1a0,puVar50,iVar47,1,
                                   (CellArray *)&pChild);
          if (iVar19 != 0) goto LAB_00141dab;
          uVar26 = (ulong)((int)local_2d0 + 1);
          pMVar35 = local_2d8;
          uVar39 = local_2b8;
          iVar19 = (int)local_2a0;
        }
        uVar52 = uVar52 + 1;
      }
      iVar19 = pageInsertArray(pMVar53,&local_230->isInit,(u8 **)&local_1a0,
                               pMVar53->aCellIdx + iVar48 * 2,iVar48 + (int)uVar39,
                               (int)pMVar35 - iVar48,(CellArray *)&pChild);
      if (iVar19 != 0) goto LAB_00141dab;
      pMVar53->nCell = (u16)local_2d8;
      pMVar53->nOverflow = '\0';
      puVar10[local_238 + 3] = (u8)((ulong)local_2d8 >> 8);
      puVar10[local_238 + 4] = (u8)pMVar53->nCell;
      uVar18 = (short)local_1a0.nKey - (short)puVar10;
      *(ushort *)(puVar10 + local_238 + 5) = uVar18 * 0x100 | uVar18 >> 8;
    }
    abDone[(long)local_270] = '\x01';
    pMVar53->nFree = (int)local_288 - szNew[(long)local_270];
  }
  goto LAB_00141a53;
LAB_00141e94:
  local_2dc = 0;
  if (((local_2a1 == '\x01') && (local_280->nCell == 0)) &&
     (pMVar53 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew),
     (int)(uint)local_280->hdrOffset <= pMVar53->nFree)) {
    local_2dc = defragmentPage(pMVar53,-1);
    copyNodeContent(pMVar53,local_280,&local_2dc);
    freePage(pMVar53,&local_2dc);
  }
  else if (bVar2 == 0 && local_278->autoVacuum != '\0') {
    for (uVar39 = 0; uVar41 != uVar39; uVar39 = uVar39 + 1) {
      pMVar53 = local_180[uVar39 - 1];
      uVar20 = sqlite3Get4byte(pMVar53->aData + 8);
      ptrmapPut(pBVar9,uVar20,'\x05',pMVar53->pgno,&local_2dc);
    }
  }
  for (; pMVar35 = local_2c8, iVar19 = local_2dc, lVar49 <= (long)pMVar38; lVar49 = lVar49 + 1) {
    freePage(apOld[lVar49],&local_2dc);
  }
  goto LAB_00140a70;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}